

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::ssl::set_trust_certificate
          (ssl *this,native_context_type nc,string_view pem,error_code *ec)

{
  X509_STORE *v;
  BIO *bp;
  X509 *x;
  ulong uVar1;
  int *piVar2;
  undefined1 uVar3;
  
  piVar2 = (int *)pem._M_str;
  v = X509_STORE_new();
  if (v != (X509_STORE *)0x0) {
    bp = BIO_new_mem_buf((void *)pem._M_len,(int)nc);
    x = PEM_read_bio_X509_AUX(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (x != (X509 *)0x0) {
      X509_STORE_add_cert(v,x);
      X509_free(x);
      SSL_CTX_set_cert_store((SSL_CTX *)this,v);
      return;
    }
    X509_STORE_free(v);
  }
  uVar1 = ERR_get_error();
  if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
    uVar3 = (int)uVar1 != 0;
  }
  else {
    uVar3 = (**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                      (&boost::asio::error::get_ssl_category()::instance,uVar1 & 0xffffffff);
  }
  *piVar2 = (int)uVar1;
  *(undefined1 *)(piVar2 + 1) = uVar3;
  *(pointer_____offset_0x10___ **)(piVar2 + 2) = &boost::asio::error::get_ssl_category()::instance;
  return;
}

Assistant:

void set_trust_certificate(native_context_type nc, string_view pem, error_code &ec)
{
#if defined TORRENT_USE_OPENSSL
	// create a new X.509 certificate store
	X509_STORE* cert_store = X509_STORE_new();
	if (!cert_store)
	{
		ec = error_code(int(ERR_get_error()), error::get_ssl_category());
		return;
	}

	// wrap the PEM certificate in a BIO, for openssl to read
	BIO* bp = BIO_new_mem_buf(
			const_cast<char*>(pem.data()),
			int(pem.size()));

	// parse the certificate into OpenSSL's internal representation
	X509* cert = PEM_read_bio_X509_AUX(bp, nullptr, nullptr, nullptr);
	BIO_free(bp);

	if (!cert)
	{
		X509_STORE_free(cert_store);
		ec = error_code(int(ERR_get_error()), error::get_ssl_category());
		return;
	}

	// add cert to cert_store
	X509_STORE_add_cert(cert_store, cert);
	X509_free(cert);

	// and lastly, replace the default cert store with ours
	SSL_CTX_set_cert_store(nc, cert_store);

#elif defined TORRENT_USE_GNUTLS
    gnutls_datum_t ca;
    ca.data = reinterpret_cast<unsigned char*>(const_cast<char*>(pem.data()));
    ca.size = unsigned(pem.size());

	// Warning: returns the number of certificates processed or a negative error code on error
	int ret = gnutls_certificate_set_x509_trust_mem(nc, &ca, GNUTLS_X509_FMT_PEM);
	if(ret < 0)
		ec = error_code(ret, error::get_ssl_category());
#endif
}